

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabConv.cpp
# Opt level: O0

void amrex::RealDescriptor::convertFromNativeFormat
               (void *out,Long nitems,void *in,RealDescriptor *od)

{
  RealDescriptor *in_stack_000000a8;
  RealDescriptor *in_stack_000000b0;
  int in_stack_000000bc;
  Long in_stack_000000c0;
  void *in_stack_000000c8;
  void *in_stack_000000d0;
  IntDescriptor *in_stack_000000f0;
  int in_stack_000000f8;
  
  FPC::NativeRealDescriptor();
  FPC::NativeLongDescriptor();
  PD_convert(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000bc,
             in_stack_000000b0,in_stack_000000a8,in_stack_000000f0,in_stack_000000f8);
  return;
}

Assistant:

void
RealDescriptor::convertFromNativeFormat (void*                 out,
                                         Long                  nitems,
                                         const void*           in,
                                         const RealDescriptor& od)
{
//    BL_PROFILE("RD:convertFromNativeFormat_vp");
    PD_convert(out,
               in,
               nitems,
               0,
               od,
               FPC::NativeRealDescriptor(),
               FPC::NativeLongDescriptor());
}